

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero-delay-observer.cpp
# Opt level: O0

void __thiscall
stateObservation::ZeroDelayObserver::setCurrentState(ZeroDelayObserver *this,StateVector *x_k)

{
  bool bVar1;
  uint uVar2;
  Matrix<double,__1,_1,_0,__1,_1> *this_00;
  StateVector *x_k_local;
  ZeroDelayObserver *this_local;
  
  bVar1 = IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::isSet(&this->x_);
  if (!bVar1) {
    __assert_fail("x_.isSet() && \"The state vector has not been set\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/zero-delay-observer.cpp"
                  ,0x22,
                  "virtual void stateObservation::ZeroDelayObserver::setCurrentState(const ObserverBase::StateVector &)"
                 );
  }
  uVar2 = (*(this->super_ObserverBase)._vptr_ObserverBase[0x14])(this,x_k);
  if ((uVar2 & 1) == 0) {
    __assert_fail("checkStateVector(x_k) && \"The size of the state vector is incorrect\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/zero-delay-observer.cpp"
                  ,0x23,
                  "virtual void stateObservation::ZeroDelayObserver::setCurrentState(const ObserverBase::StateVector &)"
                 );
  }
  this_00 = IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::operator()(&this->x_);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=(this_00,x_k);
  return;
}

Assistant:

void ZeroDelayObserver::setCurrentState(const ObserverBase::StateVector & x_k)
{
  BOOST_ASSERT(x_.isSet() && "The state vector has not been set");
  BOOST_ASSERT(checkStateVector(x_k) && "The size of the state vector is incorrect");

  x_() = x_k;
}